

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,2,-1,false>const,2,1,true>const>>
::redux<Eigen::internal::scalar_sum_op<double,double>>
          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,2,_1,false>const,2,1,true>const>>
           *this,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  variable_if_dynamic<long,__1> func_00;
  Index IVar2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>
  *pCVar3;
  Scalar SVar4;
  undefined1 local_48 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> *func_local;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
  *this_local;
  
  thisEval.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.
  super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>
  .
  super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  .m_outerStride.m_value = (long)func;
  IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
          ::rows((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                  *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
            ::cols((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                    *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<double, 2, 1>>, 1, 2, true>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>, 2, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<double, 2, 1>>, 1, 2, true>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>, 2, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
           ::derived((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                      *)this);
  internal::
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
  ::redux_evaluator((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                     *)local_48,pCVar3);
  func_00 = thisEval.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>
            .
            super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true,_true>
            .
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
            .m_outerStride;
  pCVar3 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
           ::derived((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                      *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,2,-1,false>const,2,1,true>const>>,3,2>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,2,_1,false>const,2,1,true>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                      *)local_48,(scalar_sum_op<double,_double> *)func_00.m_value,pCVar3);
  internal::
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
  ::~redux_evaluator((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                      *)local_48);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}